

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

CharIterator * __thiscall
absl::lts_20250127::Cord::FindImpl
          (CharIterator *__return_storage_ptr__,Cord *this,CharIterator it,string_view needle)

{
  size_t sVar1;
  CharIterator *pCVar2;
  bool bVar3;
  int iVar4;
  void *pvVar5;
  ulong uVar6;
  Cord *pCVar7;
  CharIterator *pCVar8;
  long lVar9;
  Cord *pCVar10;
  char *pcVar11;
  ulong size_to_compare;
  size_type __n;
  Cord *pCVar12;
  size_type __rlen;
  Cord *__n_00;
  CharIterator *pCVar13;
  Cord *cord;
  size_t n;
  CharIterator *pCVar14;
  size_t *psVar15;
  Cord *pCVar16;
  byte bVar17;
  string_view needle_00;
  ChunkIterator in_stack_fffffffffffffdb0;
  basic_string_view<char,_std::char_traits<char>_> bStack_1b8;
  CharIterator CStack_1a8;
  Cord *pCStack_110;
  Cord *pCStack_108;
  Cord *pCStack_100;
  Cord *pCStack_f8;
  CharIterator *pCStack_f0;
  CharIterator *local_e8;
  CharIterator *local_e0;
  Cord *local_d8;
  CharIterator *local_d0;
  string_view local_c8;
  Cord *local_b0;
  CordRepBtreeReader local_a8;
  
  pCVar8 = (CharIterator *)needle._M_str;
  pCVar10 = (Cord *)needle._M_len;
  bVar17 = 0;
  local_e8 = __return_storage_ptr__;
  if (pCVar10 == (Cord *)0x0) {
    pCStack_f0 = (CharIterator *)0xfeacb3;
    __assert_fail("!needle.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                  ,0x4d1,
                  "absl::Cord::CharIterator absl::Cord::FindImpl(CharIterator, absl::string_view) const"
                 );
  }
  pCVar13 = pCVar8;
  local_d8 = pCVar10;
  local_d0 = pCVar8;
  if (it.chunk_iterator_.bytes_remaining_ < pCVar10) {
    pCStack_f0 = (CharIterator *)0xfeacd2;
    __assert_fail("it.chunk_iterator_.bytes_remaining_ >= needle.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                  ,0x4d3,
                  "absl::Cord::CharIterator absl::Cord::FindImpl(CharIterator, absl::string_view) const"
                 );
  }
  do {
    sVar1 = it.chunk_iterator_.bytes_remaining_;
    pcVar11 = it.chunk_iterator_.current_chunk_._M_str;
    n = it.chunk_iterator_.current_chunk_._M_len;
    if (it.chunk_iterator_.current_chunk_._M_len == 0) {
      pCStack_f0 = (CharIterator *)0xfeac94;
      __assert_fail("!haystack_chunk.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                    ,0x4dc,
                    "absl::Cord::CharIterator absl::Cord::FindImpl(CharIterator, absl::string_view) const"
                   );
    }
    pCStack_f0 = (CharIterator *)0xfea9c8;
    pvVar5 = memchr(it.chunk_iterator_.current_chunk_._M_str,
                    (int)(char)(pCVar13->chunk_iterator_).current_chunk_._M_len,
                    it.chunk_iterator_.current_chunk_._M_len);
    pCVar8 = (CharIterator *)CONCAT71((int7)((ulong)pCVar8 >> 8),pvVar5 == (void *)0x0);
    uVar6 = (long)pvVar5 - (long)pcVar11;
    if (uVar6 == 0xffffffffffffffff || pvVar5 == (void *)0x0) {
      if (sVar1 < n) goto LAB_00feac37;
      if (((long)it.chunk_iterator_.btree_reader_.navigator_.height_ < 0) ||
         (it.chunk_iterator_.btree_reader_.navigator_.node_
          [it.chunk_iterator_.btree_reader_.navigator_.height_] == (CordRepBtree *)0x0)) {
LAB_00feabce:
        it.chunk_iterator_.bytes_remaining_ = 0;
      }
      else {
LAB_00feaa07:
        pCStack_f0 = (CharIterator *)0xfeaa0c;
        ChunkIterator::AdvanceBytesBtree(&it.chunk_iterator_,n);
      }
    }
    else {
      if (sVar1 < uVar6) {
LAB_00feac37:
        pCStack_f0 = (CharIterator *)0xfeac56;
        __assert_fail("bytes_remaining_ >= n",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                      ,0x63d,"void absl::Cord::ChunkIterator::AdvanceBytes(size_t)");
      }
      if (n < uVar6 || n - uVar6 == 0) {
        pCVar8 = (CharIterator *)(long)it.chunk_iterator_.btree_reader_.navigator_.height_;
        if (((long)pCVar8 < 0) ||
           (it.chunk_iterator_.btree_reader_.navigator_.node_[(long)pCVar8] == (CordRepBtree *)0x0))
        {
          it.chunk_iterator_.bytes_remaining_ = 0;
        }
        else {
          pCStack_f0 = (CharIterator *)0xfeab97;
          ChunkIterator::AdvanceBytesBtree(&it.chunk_iterator_,uVar6);
        }
      }
      else {
        it.chunk_iterator_.current_chunk_._M_str = pcVar11 + uVar6;
        it.chunk_iterator_.current_chunk_._M_len = n - uVar6;
        it.chunk_iterator_.bytes_remaining_ = sVar1 - uVar6;
      }
      if (it.chunk_iterator_.bytes_remaining_ < pCVar10) break;
      pCStack_f0 = (CharIterator *)0xfeaa4c;
      memcpy(&local_c8,&it.chunk_iterator_,0x98);
      if (local_b0 == (Cord *)0x0) {
LAB_00feac32:
        pCStack_f0 = (CharIterator *)0xfeac37;
        FindImpl();
        goto LAB_00feac37;
      }
      while( true ) {
        pCVar16 = local_b0;
        pcVar11 = local_c8._M_str;
        pCVar7 = (Cord *)local_c8._M_len;
        if (pCVar7 == (Cord *)0x0) {
          pCStack_f0 = (CharIterator *)0xfeac75;
          __assert_fail("!haystack_chunk.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                        ,0x4ad,
                        "bool absl::lts_20250127::(anonymous namespace)::IsSubstringInCordAt(absl::Cord::CharIterator, absl::string_view)"
                       );
        }
        __n_00 = pCVar7;
        if (pCVar10 < pCVar7) {
          __n_00 = pCVar10;
        }
        pCStack_f0 = (CharIterator *)0xfeaa96;
        local_e0 = pCVar13;
        iVar4 = bcmp(pCVar13,pcVar11,(size_t)__n_00);
        pCVar2 = local_e0;
        pCVar14 = local_e8;
        if (iVar4 != 0) break;
        pCVar12 = (Cord *)((long)pCVar10 - (long)__n_00);
        if (pCVar12 == (Cord *)0x0) {
          pCStack_f0 = (CharIterator *)0xfeac18;
          memcpy(local_e8,&it,0x98);
          return pCVar14;
        }
        cord = (Cord *)((long)pCVar16 - (long)__n_00);
        if (pCVar16 < __n_00) goto LAB_00feac37;
        if (pCVar10 < pCVar7) {
          local_c8._M_str = pcVar11 + (long)__n_00;
          local_c8._M_len = (long)pCVar7 - (long)__n_00;
          local_b0 = cord;
        }
        else {
          if (((long)local_a8.navigator_.height_ < 0) ||
             (local_a8.navigator_.node_[local_a8.navigator_.height_] == (CordRepBtree *)0x0)) {
            local_b0 = (Cord *)0x0;
            pCStack_f0 = (CharIterator *)Find;
            FindImpl();
            pCStack_f0 = pCVar2;
            pCStack_110 = pCVar12;
            pCStack_108 = pCVar10;
            pCStack_100 = pCVar7;
            pCStack_f8 = pCVar16;
            if (size_to_compare != 0) {
              uVar6 = (ulong)(cord->contents_).data_.rep_.field_0.data[0];
              if ((uVar6 & 1) == 0) {
                uVar6 = uVar6 >> 1;
              }
              else {
                uVar6 = ((cord->contents_).data_.rep_.field_0.as_tree.rep)->length;
              }
              if (size_to_compare <= uVar6) {
                if (uVar6 != size_to_compare) {
                  CharIterator::CharIterator(&CStack_1a8,cord);
                  pCVar14 = &CStack_1a8;
                  psVar15 = (size_t *)&stack0xfffffffffffffdb0;
                  for (lVar9 = 0x13; lVar9 != 0; lVar9 = lVar9 + -1) {
                    *psVar15 = (pCVar14->chunk_iterator_).current_chunk_._M_len;
                    pCVar14 = (CharIterator *)((long)pCVar14 + ((ulong)bVar17 * -2 + 1) * 8);
                    psVar15 = psVar15 + (ulong)bVar17 * -2 + 1;
                  }
                  needle_00._M_str = (char *)pCVar8;
                  needle_00._M_len = size_to_compare;
                  FindImpl(pCVar13,(Cord *)pCVar14,(CharIterator)in_stack_fffffffffffffdb0,needle_00
                          );
                  return pCVar13;
                }
                bStack_1b8._M_str = (char *)pCVar8;
                bVar3 = GenericCompare<bool,std::basic_string_view<char,std::char_traits<char>>>
                                  (cord,&bStack_1b8,size_to_compare);
                if (bVar3) goto LAB_00fead3c;
              }
              memset(pCVar13,0,0x98);
              (pCVar13->chunk_iterator_).btree_reader_.navigator_.height_ = -1;
              return pCVar13;
            }
LAB_00fead3c:
            CharIterator::CharIterator(pCVar13,cord);
            return pCVar13;
          }
          local_b0 = (Cord *)((long)pCVar16 - (long)__n_00);
          if (local_b0 == (Cord *)0x0) {
            local_c8 = (string_view)ZEXT816(0);
          }
          else {
            pCStack_f0 = (CharIterator *)0xfeab2f;
            local_c8 = cord_internal::CordRepBtreeReader::Next(&local_a8);
          }
        }
        pCVar13 = (CharIterator *)
                  ((undefined1 *)((long)&(__n_00 + -2)[-1].contents_.data_.rep_.field_0 + 8) +
                  (long)((pCVar2->chunk_iterator_).btree_reader_.navigator_.index_ + -4));
        pCVar10 = pCVar12;
        if (local_b0 == (Cord *)0x0) {
          pCStack_f0 = (CharIterator *)0xfeac32;
          FindImpl();
          goto LAB_00feac32;
        }
      }
      if (it.chunk_iterator_.bytes_remaining_ == 0) goto LAB_00feac37;
      pCVar13 = local_d0;
      pCVar10 = local_d8;
      if (it.chunk_iterator_.current_chunk_._M_len < 2) {
        pCVar8 = (CharIterator *)it.chunk_iterator_.current_chunk_._M_len;
        if (((long)it.chunk_iterator_.btree_reader_.navigator_.height_ < 0) ||
           (it.chunk_iterator_.btree_reader_.navigator_.node_
            [it.chunk_iterator_.btree_reader_.navigator_.height_] == (CordRepBtree *)0x0))
        goto LAB_00feabce;
        n = 1;
        goto LAB_00feaa07;
      }
      it.chunk_iterator_.current_chunk_._M_str = it.chunk_iterator_.current_chunk_._M_str + 1;
      pCVar8 = (CharIterator *)(it.chunk_iterator_.current_chunk_._M_len - 1);
      it.chunk_iterator_.bytes_remaining_ = it.chunk_iterator_.bytes_remaining_ - 1;
      it.chunk_iterator_.current_chunk_._M_len = (size_t)pCVar8;
    }
  } while (pCVar10 <= it.chunk_iterator_.bytes_remaining_);
  pCVar8 = local_e8;
  pCStack_f0 = (CharIterator *)0xfeabf6;
  memset(local_e8,0,0x98);
  (pCVar8->chunk_iterator_).btree_reader_.navigator_.height_ = -1;
  return pCVar8;
}

Assistant:

absl::Cord::CharIterator absl::Cord::FindImpl(CharIterator it,
                                              absl::string_view needle) const {
  // Ensure preconditions are met by callers first.

  // Needle must not be empty.
  assert(!needle.empty());
  // Haystack must be at least as large as needle.
  assert(it.chunk_iterator_.bytes_remaining_ >= needle.size());

  // Cord is a sequence of chunks. To find `needle` we go chunk by chunk looking
  // for the first char of needle, up until we have advanced `N` defined as
  // `haystack.size() - needle.size()`. If we find the first char of needle at
  // `P` and `P` is less than `N`, we then call `IsSubstringInCordAt` to
  // see if this is the needle. If not, we advance to `P + 1` and try again.
  while (it.chunk_iterator_.bytes_remaining_ >= needle.size()) {
    auto haystack_chunk = Cord::ChunkRemaining(it);
    assert(!haystack_chunk.empty());
    // Look for the first char of `needle` in the current chunk.
    auto idx = haystack_chunk.find(needle.front());
    if (idx == absl::string_view::npos) {
      // No potential match in this chunk, advance past it.
      Cord::Advance(&it, haystack_chunk.size());
      continue;
    }
    // We found the start of a potential match in the chunk. Advance the
    // iterator and haystack chunk to the match the position.
    Cord::Advance(&it, idx);
    // Check if there is enough haystack remaining to actually have a match.
    if (it.chunk_iterator_.bytes_remaining_ < needle.size()) {
      break;
    }
    // Check if this is `needle`.
    if (IsSubstringInCordAt(it, needle)) {
      return it;
    }
    // No match, increment the iterator for the next attempt.
    Cord::Advance(&it, 1);
  }
  // If we got here, we did not find `needle`.
  return char_end();
}